

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O0

int AF_A_FirePistol(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  player_t *player;
  AWeapon *this;
  byte bVar1;
  AActor *pAVar2;
  FState *state;
  PClassActor *pufftype;
  bool bVar3;
  bool local_76;
  bool local_73;
  undefined1 local_70 [12];
  FName local_64;
  AWeapon *local_60;
  AWeapon *weapon;
  void *pvStack_50;
  bool accurate;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                  ,0x48,"int AF_A_FirePistol(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_73 = true;
    if (stateowner != (AActor *)0x0) {
      local_73 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_73 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x48,"int AF_A_FirePistol(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                      ,0x48,"int AF_A_FirePistol(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_76 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_76 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_76 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                      ,0x48,"int AF_A_FirePistol(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                      ,0x48,"int AF_A_FirePistol(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      pvStack_50 = pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      pvStack_50 = (void *)0x0;
    }
    if (stateowner->player == (player_t *)0x0) {
      weapon._7_1_ = 1;
    }
    else {
      local_60 = stateowner->player->ReadyWeapon;
      if ((((local_60 != (AWeapon *)0x0) && (stateowner->player != (player_t *)0x0)) &&
          (pvStack_50 != (void *)0x0)) && (*(int *)((long)pvStack_50 + 8) == 1)) {
        bVar3 = AWeapon::DepleteAmmo(local_60,(bool)(local_60->bAltFire & 1),true,1);
        this = local_60;
        if (!bVar3) {
          return 0;
        }
        player = stateowner->player;
        FName::FName(&local_64,NAME_Flash);
        state = AActor::FindState((AActor *)this,&local_64);
        P_SetPsprite(player,PSP_FLASH,state,true);
      }
      APlayerPawn::PlayAttacking2(stateowner->player->mo);
      weapon._7_1_ = (stateowner->player->refire != 0 ^ 0xffU) & 1;
    }
    pAVar2 = stateowner;
    FSoundID::FSoundID((FSoundID *)(local_70 + 8),"weapons/pistol");
    S_Sound(pAVar2,1,(FSoundID *)(local_70 + 8),1.0,1.0);
    pAVar2 = stateowner;
    bVar1 = weapon._7_1_;
    pufftype = PClass::FindActor(NAME_BulletPuff);
    P_BulletSlope((AActor *)local_70,(FTranslatedLineTarget *)stateowner,0);
    P_GunShot(pAVar2,(bool)(bVar1 & 1),pufftype,(DAngle *)local_70);
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                ,0x48,"int AF_A_FirePistol(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FirePistol)
{
	PARAM_ACTION_PROLOGUE;

	bool accurate;

	if (self->player != nullptr)
	{
		AWeapon *weapon = self->player->ReadyWeapon;
		if (weapon != nullptr && ACTION_CALL_FROM_PSPRITE())
		{
			if (!weapon->DepleteAmmo (weapon->bAltFire, true, 1))
				return 0;

			P_SetPsprite(self->player, PSP_FLASH, weapon->FindState(NAME_Flash), true);
		}
		self->player->mo->PlayAttacking2 ();

		accurate = !self->player->refire;
	}
	else
	{
		accurate = true;
	}

	S_Sound (self, CHAN_WEAPON, "weapons/pistol", 1, ATTN_NORM);

	P_GunShot (self, accurate, PClass::FindActor(NAME_BulletPuff), P_BulletSlope (self));
	return 0;
}